

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O3

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentOperands
          (LLVMPointerGraphBuilder *this,Function *F,PSNode *arg,uint idx)

{
  long lVar1;
  CallInst *CI;
  Function *pFVar2;
  
  for (lVar1 = *(long *)(F + 8); lVar1 != 0; lVar1 = *(long *)(lVar1 + 8)) {
    CI = *(CallInst **)(lVar1 + 0x18);
    if ((CI != (CallInst *)0x0) && (CI[0x10] == (CallInst)0x53)) {
      pFVar2 = *(Function **)(CI + -0x20);
      if ((pFVar2 == (Function *)0x0) ||
         ((pFVar2[0x10] != (Function)0x0 || (*(long *)(pFVar2 + 0x18) != *(long *)(CI + 0x48))))) {
        pFVar2 = (Function *)0x0;
      }
      if (pFVar2 == F) {
        addArgumentOperands(this,CI,arg,idx);
      }
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentOperands(const llvm::Function *F,
                                                  PSNode *arg, unsigned idx) {
    using namespace llvm;

    for (auto I = F->use_begin(), E = F->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        const Value *use = *I;
#else
        const Value *use = I->getUser();
#endif
        const CallInst *CI = dyn_cast<CallInst>(use);
        if (CI && CI->getCalledFunction() == F)
            addArgumentOperands(CI, arg, idx);
    }
}